

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

String * __thiscall
doctest::detail::stringifyBinaryExpr<float,float>
          (String *__return_storage_ptr__,detail *this,float *lhs,char *op,float *rhs)

{
  String local_98;
  String local_70;
  String local_58;
  String local_40;
  float *local_28;
  float *rhs_local;
  char *op_local;
  float *lhs_local;
  
  local_28 = (float *)op;
  rhs_local = lhs;
  op_local = (char *)this;
  lhs_local = (float *)__return_storage_ptr__;
  doctest::toString(&local_58,*(float *)this);
  String::String(&local_70,(char *)rhs_local);
  String::operator+(&local_40,&local_58,&local_70);
  doctest::toString(&local_98,*local_28);
  String::operator+(__return_storage_ptr__,&local_40,&local_98);
  String::~String(&local_98);
  String::~String(&local_40);
  String::~String(&local_70);
  String::~String(&local_58);
  return __return_storage_ptr__;
}

Assistant:

String stringifyBinaryExpr(const DOCTEST_REF_WRAP(L) lhs, const char* op,
                               const DOCTEST_REF_WRAP(R) rhs) {
        // NOLINTNEXTLINE(clang-analyzer-cplusplus.NewDeleteLeaks)
        return toString(lhs) + op + toString(rhs);
    }